

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

RunnerContext * GetNextContext(Runner *runner)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(uint)runner->totalContexts;
  if (runner->totalContexts < 1) {
    uVar4 = 0;
  }
  lVar1 = -0x18;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    lVar3 = lVar1;
    if (uVar4 == uVar5) {
      puts("Ran out of contexts");
      exit(0);
    }
    lVar1 = lVar3 + 0x18;
    uVar2 = uVar5 + 1;
  } while (runner->contextUsed[uVar5] != false);
  runner->contextUsed[uVar5] = true;
  return (RunnerContext *)((long)&runner->contexts[1].node + lVar3);
}

Assistant:

RunnerContext* GetNextContext(Runner* runner) {
  for (int i = 0; i < runner->totalContexts; i++) {
    if (!runner->contextUsed[i]) {
      runner->contextUsed[i] = true;
      return &runner->contexts[i];  
    }
  }

  RUNTIME_ERROR("Ran out of contexts");
}